

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

rcode __thiscall
olc::ImageLoader_LibPNG::LoadImageResource
          (ImageLoader_LibPNG *this,Sprite *spr,string *sImageFile,ResourcePack *pack)

{
  int iVar1;
  __jmp_buf_tag *__env;
  FILE *__stream;
  png_structp png;
  png_infop info;
  anon_class_24_3_b3917af9 loadPNG;
  ResourceBuffer rb;
  istream is;
  png_structp local_1c0;
  Sprite *local_1b8;
  png_infop local_1b0;
  anon_class_24_3_b3917af9 local_1a8;
  undefined **local_190 [7];
  locale local_158 [8];
  pointer local_150;
  pointer local_140;
  long local_138 [2];
  ios_base local_128 [264];
  
  local_1b8 = spr;
  if (spr->pColData != (Pixel *)0x0) {
    operator_delete__(spr->pColData);
  }
  local_1a8.png = &local_1c0;
  local_1a8.info = &local_1b0;
  local_1a8.spr = &local_1b8;
  local_1c0 = (png_structp)png_create_read_struct("1.6.37",0,0);
  if ((local_1c0 != (png_structp)0x0) &&
     (local_1b0 = (png_infop)png_create_info_struct(local_1c0), local_1b0 != (png_infop)0x0)) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_1c0,longjmp,200);
    iVar1 = _setjmp(__env);
    if (iVar1 == 0) {
      if (pack == (ResourcePack *)0x0) {
        __stream = fopen((sImageFile->_M_dataplus)._M_p,"rb");
        if (__stream == (FILE *)0x0) {
          return NO_FILE;
        }
        png_init_io(local_1c0,__stream);
        LoadImageResource::anon_class_24_3_b3917af9::operator()(&local_1a8);
        fclose(__stream);
      }
      else {
        ResourcePack::GetFileBuffer((ResourceBuffer *)local_190,pack,sImageFile);
        std::istream::istream((istream *)local_138,(streambuf *)local_190);
        png_set_read_fn(local_1c0,local_138,pngReadStream);
        LoadImageResource::anon_class_24_3_b3917af9::operator()(&local_1a8);
        local_138[0] = _VTT;
        *(undefined8 *)((long)local_138 + *(long *)(_VTT + -0x18)) = __ITM_deregisterTMCloneTable;
        local_138[1] = 0;
        std::ios_base::~ios_base(local_128);
        local_190[0] = &PTR__ResourceBuffer_00130970;
        if (local_150 != (pointer)0x0) {
          operator_delete(local_150,(long)local_140 - (long)local_150);
        }
        local_190[0] = (undefined **)png_get_image_width;
        std::locale::~locale(local_158);
      }
      return OK;
    }
  }
  local_1b8->width = 0;
  local_1b8->height = 0;
  local_1b8->pColData = (Pixel *)0x0;
  return FAIL;
}

Assistant:

olc::rcode LoadImageResource(olc::Sprite *spr, const std::string &sImageFile, olc::ResourcePack *pack) override
		{
			UNUSED(pack);

			// clear out existing sprite
			if (spr->pColData != nullptr)
				delete[] spr->pColData;

			////////////////////////////////////////////////////////////////////////////
			// Use libpng, Thanks to Guillaume Cottenceau
			// https://gist.github.com/niw/5963798
			// Also reading png from streams
			// http://www.piko3d.net/tutorials/libpng-tutorial-loading-png-files-from-streams/
			png_structp png;
			png_infop info;

			auto loadPNG = [&]() {
				png_read_info(png, info);
				png_byte color_type;
				png_byte bit_depth;
				png_bytep *row_pointers;
				spr->width = png_get_image_width(png, info);
				spr->height = png_get_image_height(png, info);
				color_type = png_get_color_type(png, info);
				bit_depth = png_get_bit_depth(png, info);
				if (bit_depth == 16)
					png_set_strip_16(png);
				if (color_type == PNG_COLOR_TYPE_PALETTE)
					png_set_palette_to_rgb(png);
				if (color_type == PNG_COLOR_TYPE_GRAY && bit_depth < 8)
					png_set_expand_gray_1_2_4_to_8(png);
				if (png_get_valid(png, info, PNG_INFO_tRNS))
					png_set_tRNS_to_alpha(png);
				if (color_type == PNG_COLOR_TYPE_RGB || color_type == PNG_COLOR_TYPE_GRAY || color_type == PNG_COLOR_TYPE_PALETTE)
					png_set_filler(png, 0xFF, PNG_FILLER_AFTER);
				if (color_type == PNG_COLOR_TYPE_GRAY || color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
					png_set_gray_to_rgb(png);
				png_read_update_info(png, info);
				row_pointers = (png_bytep *)malloc(sizeof(png_bytep) * spr->height);
				for (int y = 0; y < spr->height; y++)
				{
					row_pointers[y] = (png_byte *)malloc(png_get_rowbytes(png, info));
				}
				png_read_image(png, row_pointers);
				////////////////////////////////////////////////////////////////////////////
				// Create sprite array
				spr->pColData = new Pixel[spr->width * spr->height];
				// Iterate through image rows, converting into sprite format
				for (int y = 0; y < spr->height; y++)
				{
					png_bytep row = row_pointers[y];
					for (int x = 0; x < spr->width; x++)
					{
						png_bytep px = &(row[x * 4]);
						spr->SetPixel(x, y, Pixel(px[0], px[1], px[2], px[3]));
					}
				}

				for (int y = 0; y < spr->height; y++) // Thanks maksym33
					free(row_pointers[y]);
				free(row_pointers);
				png_destroy_read_struct(&png, &info, nullptr);
			};

			png = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
			if (!png)
				goto fail_load;

			info = png_create_info_struct(png);
			if (!info)
				goto fail_load;

			if (setjmp(png_jmpbuf(png)))
				goto fail_load;

			if (pack == nullptr)
			{
				FILE *f = fopen(sImageFile.c_str(), "rb");
				if (!f)
					return olc::rcode::NO_FILE;
				png_init_io(png, f);
				loadPNG();
				fclose(f);
			}
			else
			{
				ResourceBuffer rb = pack->GetFileBuffer(sImageFile);
				std::istream is(&rb);
				png_set_read_fn(png, (png_voidp)&is, pngReadStream);
				loadPNG();
			}

			return olc::rcode::OK;

		fail_load:
			spr->width = 0;
			spr->height = 0;
			spr->pColData = nullptr;
			return olc::rcode::FAIL;
		}